

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

QByteArray * __thiscall QByteArray::left(QByteArray *this,qsizetype n)

{
  qsizetype qVar1;
  long in_RDX;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *this_00;
  int local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  qVar1 = size(in_RSI);
  if (in_RDX < qVar1) {
    local_14 = 0;
    qMax<long_long,int>(&local_10,&local_14);
    first(this_00,(qsizetype)in_RDI);
  }
  else {
    QByteArray(this_00,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] QByteArray left(qsizetype n) const &
    {
        if (n >= size())
            return *this;
        return first(qMax(n, 0));
    }